

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_Elastic_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Collision_Elastic_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Collision_Elastic_PDU *this)

{
  ostream *poVar1;
  KString local_2f0;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Collision_Elastic_PDU *local_18;
  Collision_Elastic_PDU *this_local;
  
  local_18 = this;
  this_local = (Collision_Elastic_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Collision Elastic PDU-\n");
  poVar1 = std::operator<<(poVar1,"Issuing Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_IssuingEntityID);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Colliding Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_250,&this->m_CollidingEntityID);
  UTILS::IndentString(&local_230,&local_250,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_290,&this->m_EventID);
  UTILS::IndentString(&local_270,&local_290,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"ContactVelocity:       ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2b0,&this->m_ContactVelocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  poVar1 = std::operator<<(poVar1,"Mass (KG):             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Mass);
  poVar1 = std::operator<<(poVar1,"\nLocation (With Respect To Entity): ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2d0,&this->m_Location);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  poVar1 = std::operator<<(poVar1,"Collision Intermediate Result:\n");
  poVar1 = std::operator<<(poVar1,"XX : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRXX);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"XY : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRXY);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"XZ : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRXZ);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"YY : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRYY);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"YZ : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRYZ);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"ZZ : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CIRZZ);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Unit Surface Normal:  ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2f0,&this->m_UnitSurfaceNormal);
  poVar1 = std::operator<<(poVar1,(string *)&local_2f0);
  poVar1 = std::operator<<(poVar1,"Coeffcient Of Resititution:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32COR);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Collision_Elastic_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Collision Elastic PDU-\n"
       << "Issuing Entity ID:\n"
       << IndentString( m_IssuingEntityID.GetAsString(), 1 )
       << "Colliding Entity ID:\n"
       << IndentString( m_CollidingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "ContactVelocity:       " << m_ContactVelocity.GetAsString()
       << "Mass (KG):             " << m_f32Mass
       << "\nLocation (With Respect To Entity): " << m_Location.GetAsString()
       << "Collision Intermediate Result:\n"
       << "XX : " << m_f32CIRXX << "\n"
       << "XY : " << m_f32CIRXY << "\n"
       << "XZ : " << m_f32CIRXZ << "\n"
       << "YY : " << m_f32CIRYY << "\n"
       << "YZ : " << m_f32CIRYZ << "\n"
       << "ZZ : " << m_f32CIRZZ << "\n"
       << "Unit Surface Normal:  " << m_UnitSurfaceNormal.GetAsString()
       << "Coeffcient Of Resititution:   " << m_f32COR
       << "\n";

    return ss.str();
}